

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tank.cpp
# Opt level: O0

void __thiscall Tank::print_out_of_map(Tank *this)

{
  ostream *poVar1;
  undefined1 local_30 [40];
  Tank *this_local;
  
  local_30._32_8_ = this;
  to_str_abi_cxx11_((Tank *)local_30);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)local_30);
  poVar1 = std::operator<<(poVar1," rolled out of battlefield");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void Tank::print_out_of_map() const {
    std::cout << to_str() << " rolled out of battlefield" << std::endl;
}